

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O2

void __thiscall
skiplist<int,std::less<int>>::
skiplist<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (skiplist<int,std::less<int>> *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last)

{
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0xc) = 0;
  *(undefined8 *)(this + 0x14) = 0;
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)(this + 0x28));
  *(undefined4 *)(this + 0x9f0) = 0;
  *(undefined4 *)(this + 0x9f4) = 0;
  *(undefined4 *)(this + 0x9f8) = 0;
  *(undefined4 *)(this + 0x9fc) = 0x3ff00000;
  skiplist<int,_std::less<int>_>::_setup_random_number_generator
            ((skiplist<int,_std::less<int>_> *)this);
  for (; first._M_current != last._M_current; first._M_current = first._M_current + 1) {
    skiplist<int,_std::less<int>_>::insert((skiplist<int,_std::less<int>_> *)this,*first._M_current)
    ;
  }
  return;
}

Assistant:

skiplist(InputIterator first, InputIterator last): size_(0), last(nullptr) {
        _setup_random_number_generator();
        // last and size_ are taken care of during insertion.
        while(first != last) {
            insert(*first);
            ++first;
        }
    }